

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Message.cpp
# Opt level: O0

void __thiscall FIX::Message::Message(Message *this)

{
  message_order local_30;
  Message *local_10;
  Message *this_local;
  
  local_10 = this;
  message_order::message_order(&local_30,normal);
  FieldMap::FieldMap(&this->super_FieldMap,&local_30);
  message_order::~message_order(&local_30);
  (this->super_FieldMap)._vptr_FieldMap = (_func_int **)&PTR__Message_00330260;
  Header::Header(&this->m_header);
  Trailer::Trailer(&this->m_trailer);
  this->m_validStructure = true;
  this->m_tag = 0;
  return;
}

Assistant:

Message::Message()
    : m_validStructure(true),
      m_tag(0) {}